

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxWhileLoop::FxWhileLoop
          (FxWhileLoop *this,FxExpression *condition,FxExpression *code,FScriptPosition *pos)

{
  FScriptPosition *pos_local;
  FxExpression *code_local;
  FxExpression *condition_local;
  FxWhileLoop *this_local;
  
  FxLoopStatement::FxLoopStatement(&this->super_FxLoopStatement,EFX_WhileLoop,pos);
  (this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxWhileLoop_00a0b558;
  this->Condition = condition;
  this->Code = code;
  (this->super_FxLoopStatement).super_FxExpression.ValueType = &TypeVoid->super_PType;
  return;
}

Assistant:

FxWhileLoop::FxWhileLoop(FxExpression *condition, FxExpression *code, const FScriptPosition &pos)
: FxLoopStatement(EFX_WhileLoop, pos), Condition(condition), Code(code)
{
	ValueType = TypeVoid;
}